

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_sigproc.c
# Opt level: O2

void fe_create_twiddle(fe_t *fe)

{
  long lVar1;
  double dVar2;
  double dVar3;
  
  for (lVar1 = 0; lVar1 < fe->fft_size / 4; lVar1 = lVar1 + 1) {
    dVar2 = ((double)(int)lVar1 * 6.283185307179586) / (double)(int)fe->fft_size;
    dVar3 = cos(dVar2);
    fe->ccc[lVar1] = (frame_t)dVar3;
    dVar2 = sin(dVar2);
    fe->sss[lVar1] = (frame_t)dVar2;
  }
  return;
}

Assistant:

void
fe_create_twiddle(fe_t * fe)
{
    int i;

    for (i = 0; i < fe->fft_size / 4; ++i) {
        float64 a = 2 * M_PI * i / fe->fft_size;
#if defined(FIXED_POINT)
        fe->ccc[i] = FLOAT2COS(cos(a));
        fe->sss[i] = FLOAT2COS(sin(a));
#else
        fe->ccc[i] = cos(a);
        fe->sss[i] = sin(a);
#endif
    }
}